

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O2

void __thiscall Automaton::buildLookaheads(Automaton *this)

{
  _Base_ptr p_Var1;
  _Rb_tree_const_iterator<std::_List_iterator<QString>_> __first;
  _List_node_base **pp_Var2;
  _List_node_base *p_Var3;
  _Rb_tree<std::_List_iterator<QString>,std::_List_iterator<QString>,std::_Identity<std::_List_iterator<QString>>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>
  *this_00;
  set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  *psVar4;
  const_iterator cVar5;
  _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  *__x;
  _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  *this_01;
  const_iterator it;
  QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
  *this_02;
  _Base_ptr *this_03;
  long in_FS_OFFSET;
  pair<QMultiMap<std::_List_iterator<Item>,_Lookback>::const_iterator,_QMultiMap<std::_List_iterator<Item>,_Lookback>::const_iterator>
  pVar6;
  _List_iterator<Item> local_48;
  _List_iterator<Item> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = &this->lookaheads;
  p_Var3 = (_List_node_base *)&this->states;
  while (p_Var3 = (((_List_base<State,_std::allocator<State>_> *)&p_Var3->_M_next)->_M_impl)._M_node
                  .super__List_node_base._M_next, p_Var3 != (_List_node_base *)&this->states) {
    pp_Var2 = (_List_node_base **)((long)(p_Var3 + 1 + 1) + 8);
    local_40._M_node = (_List_node_base *)pp_Var2;
    while (local_40._M_node = (local_40._M_node)->_M_next,
          local_40._M_node != (_List_node_base *)pp_Var2) {
      pVar6 = QMultiMap<std::_List_iterator<Item>,_Lookback>::equal_range
                        (&this->lookbacks,&local_40);
      for (cVar5._M_node = (_Base_ptr)pVar6.first.i._M_node;
          (const_iterator)cVar5._M_node != pVar6.second.i._M_node.i;
          cVar5._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar5._M_node)) {
        p_Var1 = cVar5._M_node[1]._M_parent;
        this_00 = (_Rb_tree<std::_List_iterator<QString>,std::_List_iterator<QString>,std::_Identity<std::_List_iterator<QString>>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>
                   *)QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                     ::operator[](this_02,&local_40);
        this_03 = &p_Var1[2]._M_left;
        psVar4 = QMap<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                 ::operator[]((QMap<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                               *)this_03,(_List_iterator<QString> *)&cVar5._M_node[1]._M_left);
        __first._M_node = (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        psVar4 = QMap<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                 ::operator[]((QMap<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                               *)this_03,(_List_iterator<QString> *)&cVar5._M_node[1]._M_left);
        std::
        _Rb_tree<std::_List_iterator<QString>,std::_List_iterator<QString>,std::_Identity<std::_List_iterator<QString>>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::_List_iterator<QString>>>
                  (this_00,__first,
                   (_Rb_tree_const_iterator<std::_List_iterator<QString>_>)
                   &(psVar4->_M_t)._M_impl.super__Rb_tree_header);
      }
    }
    local_48._M_node = (_List_node_base *)pp_Var2;
    for (local_40._M_node = p_Var3[1]._M_next; local_48._M_node = (local_48._M_node)->_M_next,
        local_40._M_node != p_Var3 + 1; local_40._M_node = (local_40._M_node)->_M_next) {
      __x = &QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
             ::operator[](this_02,&local_48)->_M_t;
      this_01 = &QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                 ::operator[](this_02,&local_40)->_M_t;
      std::
      _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
      ::operator=(this_01,__x);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Automaton::buildLookaheads ()
{
  for (StatePointer p = states.begin (); p != states.end (); ++p)
    {
      for (ItemPointer item = p->closure.begin (); item != p->closure.end (); ++item)
        {
          const auto range = std::as_const(lookbacks).equal_range(item);
          for (auto it = range.first; it != range.second; ++it)
            {
              const Lookback &lookback = *it;
              StatePointer q = lookback.state;

#ifndef QLALR_NO_DEBUG_LOOKAHEADS
              qerr() << "(" << id (p) << ", " << *item->rule << ") lookbacks ";
              dump (qerr(), lookback);
              qerr() << " with follows (" << id (q) << ", " << lookback.nt << ") = " << q->follows [lookback.nt] << Qt::endl;
#endif

              lookaheads [item].insert (q->follows [lookback.nt].begin (), q->follows [lookback.nt].end ());
            }
        }

      // propagate the lookahead in the kernel
      ItemPointer k = p->kernel.begin ();
      ItemPointer c = p->closure.begin ();

      for (; k != p->kernel.end (); ++k, ++c)
        lookaheads [k] = lookaheads [c];
    }
}